

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructPrim<tinyusdz::DistantLight>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               DistantLight *light,string *warn,string *err,PrimReconstructOptions *options)

{
  Property *prop;
  size_type *psVar1;
  _Rb_tree_node_base *__k;
  size_type *psVar2;
  _Rb_tree_header *p_Var3;
  uint uVar4;
  TypedAttributeWithFallback<tinyusdz::Purpose> *pTVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  long *plVar9;
  const_iterator cVar10;
  mapped_type *pmVar11;
  _Rb_tree_node_base *p_Var12;
  char *pcVar13;
  bool bVar14;
  char *pcVar15;
  string *name;
  _Rb_tree_header *p_Var16;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  undefined1 local_2e0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2c8;
  string *local_2b8;
  string *local_2b0;
  string local_2a8;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_288;
  TypedAttributeWithFallback<tinyusdz::Purpose> *local_280;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_248;
  _Rb_tree_node_base *local_240;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_238;
  long *local_230 [2];
  long local_220 [2];
  undefined1 local_210 [16];
  code *local_200;
  code *pcStack_1f8;
  ios_base local_1a0 [264];
  string local_98;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_278._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_278._M_impl.super__Rb_tree_header._M_header;
  local_278._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bVar14 = false;
  local_278._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_278._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2b8 = warn;
  local_2b0 = err;
  local_278._M_impl.super__Rb_tree_header._M_header._M_right =
       local_278._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar6 = ReconstructXformOpsFromProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_278,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)light,err);
  if (bVar6) {
    p_Var12 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var16 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
    bVar14 = true;
    if ((_Rb_tree_header *)p_Var12 != p_Var16) {
      local_238 = &light->angle;
      local_248 = &(light->super_NonboundableLight).props;
      local_288 = &(light->super_NonboundableLight).visibility;
      local_280 = &(light->super_NonboundableLight).purpose;
      local_240 = &p_Var16->_M_header;
      do {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,*(long *)(p_Var12 + 1),
                   (long)&(p_Var12[1]._M_parent)->_M_color + *(long *)(p_Var12 + 1));
        prop = (Property *)(p_Var12 + 2);
        name = (string *)local_210;
        local_210._0_8_ = &local_200;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)name,"inputs:angle","");
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_2e0,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_278,&local_98,prop,name,local_238);
        if ((code **)local_210._0_8_ != &local_200) {
          operator_delete((void *)local_210._0_8_,(ulong)((long)local_200 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        iVar7 = 0;
        if ((local_2e0._0_8_ & 0xfffffffd) == 0) {
          iVar7 = 3;
LAB_00204d20:
          bVar6 = false;
        }
        else {
          bVar6 = true;
          if (local_2e0._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_210,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_210,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_210,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_210,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_210,"():",3);
            poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_210,0xd1e);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            local_230[0] = local_220;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_230,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[13],std::__cxx11::string>
                      (&local_2a8,(fmt *)local_230,(string *)"inputs:angle",
                       (char (*) [13])(local_2e0 + 8),name);
            poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_210,local_2a8._M_dataplus._M_p,
                                local_2a8._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
              operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_230[0] != local_220) {
              operator_delete(local_230[0],local_220[0] + 1);
            }
            if (local_2b0 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar9 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)local_230,(ulong)(local_2b0->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_2a8.field_2._M_allocated_capacity = *psVar1;
                local_2a8.field_2._8_8_ = plVar9[3];
                local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
              }
              else {
                local_2a8.field_2._M_allocated_capacity = *psVar1;
                local_2a8._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_2a8._M_string_length = plVar9[1];
              *plVar9 = (long)psVar1;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)local_2b0,(string *)&local_2a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
                operator_delete(local_2a8._M_dataplus._M_p,
                                local_2a8.field_2._M_allocated_capacity + 1);
              }
              if (local_230[0] != local_220) {
                operator_delete(local_230[0],local_220[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
            ::std::ios_base::~ios_base(local_1a0);
            iVar7 = 1;
            goto LAB_00204d20;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._8_8_ != &aStack_2c8) {
          operator_delete((void *)local_2e0._8_8_,aStack_2c8._M_allocated_capacity + 1);
        }
        if (bVar6) {
          __k = p_Var12 + 1;
          iVar7 = ::std::__cxx11::string::compare((char *)__k);
          if (iVar7 == 0) {
            local_210._0_8_ = &local_200;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"purpose","");
            cVar10 = ::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_278,(key_type *)local_210);
            if ((code **)local_210._0_8_ != &local_200) {
              operator_delete((void *)local_210._0_8_,(ulong)((long)local_200 + 1));
            }
            if ((_Rb_tree_header *)cVar10._M_node == &local_278._M_impl.super__Rb_tree_header) {
              if (((ulong)p_Var12[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                Attribute::type_name_abi_cxx11_((string *)local_210,(Attribute *)prop);
                local_2e0._0_8_ = local_2e0 + 0x10;
                local_2e0._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x5;
                local_2e0._16_6_ = 0x6e656b6f74;
                if (((local_210._8_8_ == 5) &&
                    ((char)*(int *)(local_210._0_8_ + 4) == 'n' &&
                     *(int *)local_210._0_8_ == 0x656b6f74)) &&
                   (uVar4 = *(uint *)((long)&p_Var12[0x17]._M_parent + 4), uVar4 < 2)) {
                  if ((code **)local_210._0_8_ != &local_200) {
                    operator_delete((void *)local_210._0_8_,(ulong)((long)local_200 + 1));
                  }
                  if (uVar4 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_210,"[warn]",6);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_210,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_210,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_210,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_210,"():",3);
                    poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_210,0xd20)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_210,"No value assigned to `",0x16);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_210,"purpose",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_210,"` token attribute. Set default token value.",
                               0x2b);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_210,"\n",1);
                    pTVar5 = local_280;
                    if (local_2b8 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar9 = (long *)::std::__cxx11::string::_M_append
                                                 ((char *)&local_2a8,
                                                  (ulong)(local_2b0->_M_dataplus)._M_p);
                      psVar1 = (size_type *)(plVar9 + 2);
                      if ((size_type *)*plVar9 == psVar1) {
                        local_2e0._16_8_ = *psVar1;
                        aStack_2c8._M_allocated_capacity = plVar9[3];
                        local_2e0._0_8_ = local_2e0 + 0x10;
                      }
                      else {
                        local_2e0._16_8_ = *psVar1;
                        local_2e0._0_8_ = (size_type *)*plVar9;
                      }
                      local_2e0._8_8_ = plVar9[1];
                      *plVar9 = (long)psVar1;
                      plVar9[1] = 0;
                      *(undefined1 *)(plVar9 + 2) = 0;
                      ::std::__cxx11::string::operator=((string *)local_2b8,(string *)local_2e0);
                      if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
                        operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
                        operator_delete(local_2a8._M_dataplus._M_p,
                                        local_2a8.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
                    ::std::ios_base::~ios_base(local_1a0);
                    AttrMetas::operator=(&pTVar5->_metas,(AttrMetas *)(p_Var12 + 7));
                    pcVar15 = "purpose";
                    pcVar13 = "";
LAB_00205a4c:
                    local_210._0_8_ = &local_200;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_210,pcVar15,pcVar13);
                    ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)&local_278,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_210);
                    if ((code **)local_210._0_8_ != &local_200) {
                      operator_delete((void *)local_210._0_8_,(ulong)((long)local_200 + 1));
                    }
                    goto LAB_0020583b;
                  }
                }
                else if ((code **)local_210._0_8_ != &local_200) {
                  operator_delete((void *)local_210._0_8_,(ulong)((long)local_200 + 1));
                }
              }
              local_210._8_8_ = 0;
              local_210._0_8_ = PurposeEnumHandler;
              pcStack_1f8 = ::std::
                            _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            ::_M_invoke;
              local_200 = ::std::
                          _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          ::_M_manager;
              local_2e0._0_8_ = local_2e0 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"purpose","");
              bVar6 = options->strict_allowedToken_check;
              local_48 = (code *)0x0;
              pcStack_40 = (code *)0x0;
              local_58._M_unused._M_object = (void *)0x0;
              local_58._8_8_ = 0;
              if (local_200 != (code *)0x0) {
                (*local_200)(&local_58,local_210,2);
                local_48 = local_200;
                pcStack_40 = pcStack_1f8;
              }
              pTVar5 = local_280;
              bVar6 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                ((string *)local_2e0,bVar6,
                                 (EnumHandlerFun<tinyusdz::Purpose> *)&local_58,(Attribute *)prop,
                                 local_280,local_2b8,local_2b0);
              if (local_48 != (code *)0x0) {
                (*local_48)(&local_58,&local_58,__destroy_functor);
              }
              if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
                operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
              }
              iVar7 = 1;
              if (bVar6) {
                AttrMetas::operator=(&pTVar5->_metas,(AttrMetas *)(p_Var12 + 7));
                local_2e0._0_8_ = local_2e0 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"purpose","");
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_278,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2e0);
                if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
LAB_00205670:
                  operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
                }
LAB_0020567d:
                iVar7 = 3;
              }
LAB_0020580d:
              if (local_200 != (code *)0x0) {
                (*local_200)(local_210,local_210,3);
              }
              goto LAB_0020582c;
            }
          }
          else {
            iVar7 = ::std::__cxx11::string::compare((char *)__k);
            if (iVar7 == 0) {
              local_210._0_8_ = &local_200;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"visibility","")
              ;
              cVar10 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_278,(key_type *)local_210);
              if ((code **)local_210._0_8_ != &local_200) {
                operator_delete((void *)local_210._0_8_,(ulong)((long)local_200 + 1));
              }
              if ((_Rb_tree_header *)cVar10._M_node == &local_278._M_impl.super__Rb_tree_header) {
                if (((ulong)p_Var12[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                  Attribute::type_name_abi_cxx11_((string *)local_210,(Attribute *)prop);
                  local_2e0._0_8_ = local_2e0 + 0x10;
                  local_2e0._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x5;
                  local_2e0._16_6_ = 0x6e656b6f74;
                  if (((local_210._8_8_ == 5) &&
                      ((char)*(int *)(local_210._0_8_ + 4) == 'n' &&
                       *(int *)local_210._0_8_ == 0x656b6f74)) &&
                     (uVar4 = *(uint *)((long)&p_Var12[0x17]._M_parent + 4), uVar4 < 2)) {
                    if ((code **)local_210._0_8_ != &local_200) {
                      operator_delete((void *)local_210._0_8_,(ulong)((long)local_200 + 1));
                    }
                    if (uVar4 == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_210,"[warn]",6);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_210,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_210,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_210,"ReconstructPrim",0xf);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_210,"():",3);
                      poVar8 = (ostream *)
                               ::std::ostream::operator<<((ostringstream *)local_210,0xd22);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_210,"No value assigned to `",0x16);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_210,"visibility",10);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_210,"` token attribute. Set default token value.",
                                 0x2b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_210,"\n",1);
                      if (local_2b8 != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        plVar9 = (long *)::std::__cxx11::string::_M_append
                                                   ((char *)&local_2a8,
                                                    (ulong)(local_2b0->_M_dataplus)._M_p);
                        psVar1 = (size_type *)(plVar9 + 2);
                        if ((size_type *)*plVar9 == psVar1) {
                          local_2e0._16_8_ = *psVar1;
                          aStack_2c8._M_allocated_capacity = plVar9[3];
                          local_2e0._0_8_ = local_2e0 + 0x10;
                        }
                        else {
                          local_2e0._16_8_ = *psVar1;
                          local_2e0._0_8_ = (size_type *)*plVar9;
                        }
                        local_2e0._8_8_ = plVar9[1];
                        *plVar9 = (long)psVar1;
                        plVar9[1] = 0;
                        *(undefined1 *)(plVar9 + 2) = 0;
                        ::std::__cxx11::string::operator=((string *)local_2b8,(string *)local_2e0);
                        if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
                          operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
                          operator_delete(local_2a8._M_dataplus._M_p,
                                          local_2a8.field_2._M_allocated_capacity + 1);
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
                      ::std::ios_base::~ios_base(local_1a0);
                      AttrMetas::operator=(&local_288->_metas,(AttrMetas *)(p_Var12 + 7));
                      pcVar15 = "visibility";
                      pcVar13 = "";
                      goto LAB_00205a4c;
                    }
                  }
                  else if ((code **)local_210._0_8_ != &local_200) {
                    operator_delete((void *)local_210._0_8_,(ulong)((long)local_200 + 1));
                  }
                }
                local_210._8_8_ = 0;
                local_210._0_8_ = VisibilityEnumHandler;
                pcStack_1f8 = ::std::
                              _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              ::_M_invoke;
                local_200 = ::std::
                            _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            ::_M_manager;
                local_2e0._0_8_ = local_2e0 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2e0,"visibility","");
                bVar6 = options->strict_allowedToken_check;
                local_68 = (code *)0x0;
                pcStack_60 = (code *)0x0;
                local_78._M_unused._M_object = (void *)0x0;
                local_78._8_8_ = 0;
                if (local_200 != (code *)0x0) {
                  (*local_200)(&local_78,local_210,2);
                  local_68 = local_200;
                  pcStack_60 = pcStack_1f8;
                }
                bVar6 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                                  ((string *)local_2e0,bVar6,
                                   (EnumHandlerFun<tinyusdz::Visibility> *)&local_78,
                                   (Attribute *)prop,local_288,local_2b8,local_2b0);
                if (local_68 != (code *)0x0) {
                  (*local_68)(&local_78,&local_78,__destroy_functor);
                }
                psVar1 = (size_type *)(local_2e0 + 0x10);
                if ((size_type *)local_2e0._0_8_ != psVar1) {
                  operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
                }
                iVar7 = 1;
                if (bVar6) {
                  AttrMetas::operator=(&local_288->_metas,(AttrMetas *)(p_Var12 + 7));
                  local_2e0._0_8_ = psVar1;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_2e0,"visibility","");
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&local_278,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2e0);
                  if ((size_type *)local_2e0._0_8_ != psVar1) goto LAB_00205670;
                  goto LAB_0020567d;
                }
                goto LAB_0020580d;
              }
            }
            else {
              cVar10 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_278,(key_type *)__k);
              p_Var3 = &local_278._M_impl.super__Rb_tree_header;
              if ((_Rb_tree_header *)cVar10._M_node == p_Var3) {
                pmVar11 = ::std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                          ::operator[](local_248,(key_type *)__k);
                ::std::__cxx11::string::_M_assign((string *)pmVar11);
                (pmVar11->_attrib)._varying_authored = (bool)p_Var12[3].field_0x4;
                (pmVar11->_attrib)._variability = p_Var12[3]._M_color;
                ::std::__cxx11::string::_M_assign((string *)&(pmVar11->_attrib)._type_name);
                linb::any::operator=((any *)&(pmVar11->_attrib)._var,(any *)&p_Var12[4]._M_parent);
                (pmVar11->_attrib)._var._blocked = SUB41(p_Var12[5]._M_color,0);
                ::std::
                vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                             *)&(pmVar11->_attrib)._var._ts,
                            (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                             *)&p_Var12[5]._M_parent);
                (pmVar11->_attrib)._var._ts._dirty = SUB41(p_Var12[6]._M_color,0);
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          (&(pmVar11->_attrib)._paths,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var12[6]._M_parent);
                AttrMetas::operator=(&(pmVar11->_attrib)._metas,(AttrMetas *)(p_Var12 + 7));
                *(_Base_ptr *)&pmVar11->_listOpQual = p_Var12[0x17]._M_parent;
                (pmVar11->_rel).type = *(Type *)&p_Var12[0x17]._M_left;
                Path::operator=(&(pmVar11->_rel).targetPath,(Path *)&p_Var12[0x17]._M_right);
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          (&(pmVar11->_rel).targetPathVector,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var12[0x1e]._M_parent);
                (pmVar11->_rel).listOpQual = p_Var12[0x1f]._M_color;
                AttrMetas::operator=(&(pmVar11->_rel)._metas,(AttrMetas *)&p_Var12[0x1f]._M_parent);
                (pmVar11->_rel)._varying_authored = *(bool *)&p_Var12[0x2f]._M_left;
                ::std::__cxx11::string::_M_assign((string *)&pmVar11->_prop_value_type_name);
                pmVar11->_has_custom = *(bool *)&p_Var12[0x30]._M_right;
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_278,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k)
                ;
              }
              cVar10 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_278,(key_type *)__k);
              if ((_Rb_tree_header *)cVar10._M_node == p_Var3) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_210,"[warn]",6);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_210,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_210,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_210,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_210,"():",3);
                poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_210,0xd24);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2e0,"Unsupported/unimplemented property: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__k);
                poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_210,(char *)local_2e0._0_8_,local_2e0._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                psVar1 = (size_type *)(local_2e0 + 0x10);
                if ((size_type *)local_2e0._0_8_ != psVar1) {
                  operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
                }
                if (local_2b8 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar9 = (long *)::std::__cxx11::string::_M_append
                                             ((char *)&local_2a8,
                                              (ulong)(local_2b0->_M_dataplus)._M_p);
                  psVar2 = (size_type *)(plVar9 + 2);
                  if ((size_type *)*plVar9 == psVar2) {
                    local_2e0._16_8_ = *psVar2;
                    aStack_2c8._M_allocated_capacity = plVar9[3];
                    local_2e0._0_8_ = psVar1;
                  }
                  else {
                    local_2e0._16_8_ = *psVar2;
                    local_2e0._0_8_ = (size_type *)*plVar9;
                  }
                  local_2e0._8_8_ = plVar9[1];
                  *plVar9 = (long)psVar2;
                  plVar9[1] = 0;
                  *(undefined1 *)(plVar9 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)local_2b8,(string *)local_2e0);
                  if ((size_type *)local_2e0._0_8_ != psVar1) {
                    operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
                    operator_delete(local_2a8._M_dataplus._M_p,
                                    local_2a8.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
                ::std::ios_base::~ios_base(local_1a0);
              }
            }
          }
        }
        else {
LAB_0020582c:
          if ((iVar7 != 3) && (iVar7 != 0)) {
            bVar14 = false;
            goto LAB_00205a8a;
          }
        }
LAB_0020583b:
        p_Var12 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var12);
      } while (p_Var12 != local_240);
      bVar14 = true;
    }
  }
LAB_00205a8a:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_278,(_Link_type)local_278._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar14;
}

Assistant:

bool ReconstructPrim<DistantLight>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    DistantLight *light,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;
  (void)options;

  std::set<std::string> table;

  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &light->xformOps, err)) {
    return false;
  }

  for (const auto &prop : properties) {
    // PARSE_PROPERTY(prop, "inputs:colorTemperature", light->colorTemperature)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:angle", DistantLight, light->angle)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, DistantLight,
                       light->purpose, options.strict_allowedToken_check)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, DistantLight,
                   light->visibility, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, SphereLight, light->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}